

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O0

void __thiscall
cmFilePathChecksum::setupParentDirs
          (cmFilePathChecksum *this,string *currentSrcDir,string *currentBinDir,
          string *projectSrcDir,string *projectBinDir)

{
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string *local_30;
  string *projectBinDir_local;
  string *projectSrcDir_local;
  string *currentBinDir_local;
  string *currentSrcDir_local;
  cmFilePathChecksum *this_local;
  
  local_30 = projectBinDir;
  projectBinDir_local = projectSrcDir;
  projectSrcDir_local = currentBinDir;
  currentBinDir_local = currentSrcDir;
  currentSrcDir_local = (string *)this;
  cmsys::SystemTools::GetRealPath(&local_50,currentSrcDir,(string *)0x0);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  cmsys::SystemTools::GetRealPath(&local_70,projectSrcDir_local,(string *)0x0);
  std::__cxx11::string::operator=((string *)(this->parentDirs + 1),(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  cmsys::SystemTools::GetRealPath(&local_90,projectBinDir_local,(string *)0x0);
  std::__cxx11::string::operator=((string *)(this->parentDirs + 2),(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  cmsys::SystemTools::GetRealPath(&local_b0,local_30,(string *)0x0);
  std::__cxx11::string::operator=((string *)(this->parentDirs + 3),(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::operator=((string *)&this->parentDirs[0].second,"CurrentSource");
  std::__cxx11::string::operator=((string *)&this->parentDirs[1].second,"CurrentBinary");
  std::__cxx11::string::operator=((string *)&this->parentDirs[2].second,"ProjectSource");
  std::__cxx11::string::operator=((string *)&this->parentDirs[3].second,"ProjectBinary");
  return;
}

Assistant:

void cmFilePathChecksum::setupParentDirs(const std::string& currentSrcDir,
                                         const std::string& currentBinDir,
                                         const std::string& projectSrcDir,
                                         const std::string& projectBinDir)
{
  parentDirs[0].first = cmsys::SystemTools::GetRealPath(currentSrcDir);
  parentDirs[1].first = cmsys::SystemTools::GetRealPath(currentBinDir);
  parentDirs[2].first = cmsys::SystemTools::GetRealPath(projectSrcDir);
  parentDirs[3].first = cmsys::SystemTools::GetRealPath(projectBinDir);

  parentDirs[0].second = "CurrentSource";
  parentDirs[1].second = "CurrentBinary";
  parentDirs[2].second = "ProjectSource";
  parentDirs[3].second = "ProjectBinary";
}